

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_impl.c
# Opt level: O2

int impl_verify_picnic3(picnic_instance_t *instance,uint8_t *plaintext,uint8_t *public_key,
                       uint8_t *msg,size_t msglen,uint8_t *signature,size_t signature_len)

{
  long *plVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  uint leafIndex;
  char cVar7;
  _Bool _Var8;
  int iVar9;
  int iVar10;
  size_t sVar11;
  uint16_t *puVar12;
  size_t sVar13;
  size_t __size;
  void *__dest;
  msgs_t *msgs;
  uint16_t *puVar14;
  randomTape_t *__ptr;
  uint8_t *puVar15;
  byte bVar16;
  size_t t;
  ulong uVar17;
  proof2_t *ppVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  size_t j_1;
  uint16_t value;
  uint8_t *puVar22;
  ulong uVar23;
  size_t j;
  ulong uVar24;
  randomTape_t *prVar25;
  long lVar26;
  signature2_t sig;
  mzd_local_t m_maskedKey [1];
  commitments_t C [4];
  commitments_t Cv;
  commitments_t Ch;
  tree_t seed;
  tree_t treeCv;
  tree_t iSeedsTree;
  mzd_local_t m_plaintext [1];
  ulong local_258;
  signature2_t local_220;
  mzd_local_t local_1c0;
  uint16_t *local_1a0;
  uint16_t *local_198;
  uint8_t *local_190;
  uint8_t *local_188;
  commitments_t local_180 [4];
  commitments_t local_138;
  commitments_t local_128;
  lowmc_simulate_online_f local_118;
  uint8_t *local_110;
  size_t local_108;
  tree_t local_100 [2];
  tree_t local_c0;
  tree_t local_a0;
  mzd_local_t local_80 [2];
  
  local_188 = plaintext;
  _Var8 = allocateSignature2(&local_220,instance);
  if (!_Var8) {
LAB_00119f06:
    iVar9 = -1;
    goto LAB_00119f0e;
  }
  uVar17 = (ulong)instance->digest_size + 0x20;
  if (signature_len < uVar17) {
    iVar9 = 1;
    goto LAB_00119f0e;
  }
  local_190 = public_key;
  local_108 = msglen;
  memcpy(local_220.challenge,signature,(ulong)instance->digest_size);
  bVar2 = instance->digest_size;
  puVar22 = signature + bVar2;
  local_220.salt._0_8_ = *(undefined8 *)puVar22;
  local_220.salt._8_8_ = *(undefined8 *)(puVar22 + 8);
  local_220.salt._16_8_ = *(undefined8 *)(puVar22 + 0x10);
  local_220.salt._24_8_ = *(undefined8 *)(puVar22 + 0x18);
  expandChallenge(local_220.challengeC,local_220.challengeP,local_220.challenge,instance);
  sVar11 = revealSeedsSize((uint)instance->num_rounds,local_220.challengeC,
                           (ulong)instance->num_opened_rounds,instance);
  local_220.iSeedInfoLen = sVar11;
  if (sVar11 != 0xffffffffffffffff) {
    uVar4 = instance->num_rounds;
    bVar3 = instance->num_opened_rounds;
    local_110 = msg;
    puVar12 = getMissingLeavesList(local_220.challengeC,instance);
    sVar13 = openMerkleTreeSize((ulong)instance->num_rounds,puVar12,(ulong)uVar4 - (ulong)bVar3,
                                instance);
    local_220.cvInfoLen = sVar13;
    free(puVar12);
    if (sVar13 != 0xffffffffffffffff) {
      local_180[0].hashes._0_2_ = 0;
      __size = revealSeedsSize((uint)instance->num_MPC_parties,(uint16_t *)local_180,1,instance);
      puVar14 = local_220.challengeP;
      puVar12 = local_220.challengeC;
      if (__size != 0xffffffffffffffff) {
        puVar22 = signature + (ulong)bVar2 + 0x20;
        sVar13 = sVar11 + uVar17 + sVar13;
        local_258 = (ulong)instance->num_rounds;
        for (uVar17 = 0; sVar11 = local_220.iSeedInfoLen, local_258 != uVar17; uVar17 = uVar17 + 1)
        {
          bVar2 = instance->num_opened_rounds;
          iVar9 = contains(puVar12,(ulong)bVar2,(uint16_t)uVar17);
          if (iVar9 != 0) {
            iVar9 = indexOf(puVar12,(ulong)bVar2,(uint16_t)uVar17);
            uVar23 = (ulong)instance->view_size;
            if (instance->num_MPC_parties - 1 == (uint)puVar14[iVar9]) {
              uVar23 = 0;
            }
            sVar13 = sVar13 + __size + (ulong)instance->view_size + (ulong)instance->digest_size +
                     (ulong)instance->input_output_size + uVar23;
          }
        }
        if (sVar13 == signature_len) {
          local_220.iSeedInfo = (uint8_t *)malloc(local_220.iSeedInfoLen);
          memcpy(local_220.iSeedInfo,puVar22,sVar11);
          sVar13 = local_220.cvInfoLen;
          local_220.cvInfo = (uint8_t *)malloc(local_220.cvInfoLen);
          memcpy(local_220.cvInfo,puVar22 + sVar11,sVar13);
          puVar22 = puVar22 + sVar11 + sVar13;
          lVar26 = 0;
          for (uVar17 = 0; uVar17 < local_258; uVar17 = uVar17 + 1) {
            iVar9 = contains(local_220.challengeC,(ulong)instance->num_opened_rounds,
                             (uint16_t)uVar17);
            if (iVar9 != 0) {
              allocateProof2((proof2_t *)((long)&(local_220.proofs)->seedInfo + lVar26),instance);
              ppVar18 = local_220.proofs;
              *(size_t *)((long)&(local_220.proofs)->seedInfoLen + lVar26) = __size;
              __dest = malloc(__size);
              *(void **)((long)&ppVar18->seedInfo + lVar26) = __dest;
              memcpy(__dest,puVar22,__size);
              puVar12 = local_220.challengeP;
              puVar22 = puVar22 + *(long *)((long)&ppVar18->seedInfoLen + lVar26);
              iVar9 = indexOf(local_220.challengeC,(ulong)instance->num_opened_rounds,
                              (uint16_t)uVar17);
              if (instance->num_MPC_parties - 1 != (uint)puVar12[iVar9]) {
                memcpy(*(void **)((long)&ppVar18->aux + lVar26),puVar22,(ulong)instance->view_size);
                bVar2 = instance->view_size;
                if ((~(0xff << ((uint)(instance->lowmc).m * (uint)(instance->lowmc).r * -3 +
                                (uint)bVar2 * 8 & 0x1f)) &
                    (uint)*(byte *)(*(long *)((long)&(local_220.proofs)->aux + lVar26) + -1 +
                                   (ulong)bVar2)) != 0) goto LAB_00119f06;
                puVar22 = puVar22 + bVar2;
                ppVar18 = local_220.proofs;
              }
              memcpy(*(void **)((long)&ppVar18->input + lVar26),puVar22,
                     (ulong)instance->input_output_size);
              bVar2 = instance->input_output_size;
              if ((~(0xff << ((uint)bVar2 * 8 - (uint)(instance->lowmc).n & 0x1f)) &
                  (uint)*(byte *)(*(long *)((long)&(local_220.proofs)->input + lVar26) + -1 +
                                 (ulong)bVar2)) != 0) goto LAB_00119f06;
              bVar3 = instance->view_size;
              uVar23 = (ulong)bVar3;
              puVar22 = puVar22 + bVar2;
              memcpy(*(void **)((long)&(local_220.proofs)->msgs + lVar26),puVar22,uVar23);
              if ((~(0xff << ((uint)(instance->lowmc).m * (uint)(instance->lowmc).r * -3 +
                              (uint)bVar3 * 8 & 0x1f)) &
                  (uint)*(byte *)(*(long *)((long)&(local_220.proofs)->msgs + lVar26) + -1 + uVar23)
                  ) != 0) goto LAB_00119f06;
              memcpy(*(void **)((long)&(local_220.proofs)->C + lVar26),puVar22 + uVar23,
                     (ulong)instance->digest_size);
              puVar22 = puVar22 + uVar23 + instance->digest_size;
              local_258 = (ulong)instance->num_rounds;
            }
            lVar26 = lVar26 + 0x38;
          }
          allocateCommitments2(local_180,instance,(ulong)instance->num_MPC_parties);
          allocateCommitments2(local_180 + 1,instance,(ulong)instance->num_MPC_parties);
          allocateCommitments2(local_180 + 2,instance,(ulong)instance->num_MPC_parties);
          allocateCommitments2(local_180 + 3,instance,(ulong)instance->num_MPC_parties);
          msgs = allocateMsgsVerify(instance);
          if (msgs != (msgs_t *)0x0) {
            _Var8 = createTree(&local_c0,(uint)instance->num_rounds,(uint)instance->digest_size);
            if (_Var8) {
              uVar17 = (ulong)((uint)instance->num_opened_rounds * 2);
              puVar12 = (uint16_t *)malloc(uVar17);
              puVar14 = (uint16_t *)malloc(uVar17);
              uVar4 = instance->num_rounds;
              __ptr = (randomTape_t *)malloc((ulong)uVar4 * 0x98);
              local_1a0 = puVar14;
              local_198 = puVar12;
              if ((puVar12 == (uint16_t *)0x0) || (puVar14 == (uint16_t *)0x0)) {
                iVar9 = -1;
              }
              else if (__ptr == (randomTape_t *)0x0) {
                iVar9 = -1;
              }
              else {
                _Var8 = createTree(&local_a0,(uint)uVar4,(uint)instance->seed_size);
                iVar9 = -1;
                if (_Var8) {
                  iVar10 = reconstructSeeds(&local_a0,local_220.challengeC,
                                            (ulong)instance->num_opened_rounds,local_220.iSeedInfo,
                                            local_220.iSeedInfoLen,local_220.salt,0,instance);
                  if (iVar10 == 0) {
                    allocateCommitments2(&local_128,instance,(ulong)instance->num_rounds);
                    allocateCommitments2(&local_138,instance,(ulong)instance->num_rounds);
                    mzd_from_char_array(local_80,local_188,(ulong)instance->input_output_size);
                    uVar17 = (ulong)instance->num_MPC_parties;
                    sVar11 = uVar17 - 1;
                    local_118 = lowmc_simulate_online_get_implementation(&instance->lowmc);
                    for (uVar23 = 0; uVar4 = instance->num_rounds, uVar23 < uVar4;
                        uVar23 = uVar23 + 1) {
                      value = (uint16_t)uVar23;
                      iVar9 = contains(local_220.challengeC,(ulong)instance->num_opened_rounds,value
                                      );
                      bVar2 = instance->num_MPC_parties;
                      leafIndex = (uint)uVar23;
                      if (iVar9 == 0) {
                        puVar22 = getLeaf(&local_a0,leafIndex);
                        _Var8 = generateSeeds(local_100,(uint)bVar2,puVar22,local_220.salt,uVar23,
                                              instance);
                        if (!_Var8) goto LAB_0011a825;
                      }
                      else {
                        _Var8 = createTree(local_100,(uint)bVar2,(uint)instance->seed_size);
                        puVar12 = local_220.challengeP;
                        if (!_Var8) goto LAB_0011a825;
                        iVar9 = indexOf(local_220.challengeC,(ulong)instance->num_opened_rounds,
                                        value);
                        local_1c0.w64[0] = CONCAT62(local_1c0.w64[0]._2_6_,puVar12[iVar9]);
                        iVar9 = reconstructSeeds(local_100,(uint16_t *)&local_1c0,1,
                                                 local_220.proofs[uVar23].seedInfo,
                                                 local_220.proofs[uVar23].seedInfoLen,local_220.salt
                                                 ,leafIndex,instance);
                        if (iVar9 != 0) {
                          clearTree(local_100);
                          goto LAB_0011a825;
                        }
                      }
                      prVar25 = __ptr + uVar23;
                      puVar22 = getLeaves(local_100);
                      createRandomTapes(prVar25,puVar22,local_220.salt,uVar23,instance);
                      puVar12 = local_220.challengeC;
                      bVar2 = instance->num_opened_rounds;
                      iVar9 = contains(local_220.challengeC,(ulong)bVar2,value);
                      puVar14 = local_220.challengeP;
                      if (iVar9 == 0) {
                        computeAuxTape(prVar25,(uint8_t *)0x0,instance);
                        lVar26 = 0;
                        plVar1 = (long *)((long)&local_180[0].hashes + (ulong)((leafIndex & 3) << 4)
                                         );
                        for (uVar24 = 0; uVar24 < instance->num_MPC_parties; uVar24 = uVar24 + 4) {
                          uVar21 = (uint)uVar24;
                          local_1c0.w64[0] = (word)getLeaf(local_100,uVar21);
                          local_1c0.w64[1] = (word)getLeaf(local_100,uVar21 + 1);
                          local_1c0.w64[2] = (word)getLeaf(local_100,uVar21 + 2);
                          local_1c0.w64[3] = (word)getLeaf(local_100,uVar21 + 3);
                          commit_x4((uint8_t **)(*plVar1 + lVar26),(uint8_t **)&local_1c0,
                                    local_220.salt,uVar23,uVar24,instance);
                          lVar26 = lVar26 + 0x20;
                        }
                        puVar22 = *(uint8_t **)(*plVar1 + -8 + uVar17 * 8);
                        puVar15 = getLeaf(local_100,(uint)sVar11);
                        commit(puVar22,puVar15,prVar25->aux_bits,local_220.salt,uVar23,sVar11,
                               instance);
                      }
                      else {
                        iVar9 = indexOf(puVar12,(ulong)bVar2,value);
                        lVar26 = 0;
                        uVar4 = puVar14[iVar9];
                        plVar1 = (long *)((long)&local_180[0].hashes + (ulong)((leafIndex & 3) << 4)
                                         );
                        for (uVar24 = 0; uVar24 < instance->num_MPC_parties; uVar24 = uVar24 + 4) {
                          uVar21 = (uint)uVar24;
                          local_1c0.w64[0] = (word)getLeaf(local_100,uVar21);
                          local_1c0.w64[1] = (word)getLeaf(local_100,uVar21 + 1);
                          local_1c0.w64[2] = (word)getLeaf(local_100,uVar21 + 2);
                          local_1c0.w64[3] = (word)getLeaf(local_100,uVar21 + 3);
                          commit_x4((uint8_t **)(*plVar1 + lVar26),(uint8_t **)&local_1c0,
                                    local_220.salt,uVar23,uVar24,instance);
                          lVar26 = lVar26 + 0x20;
                        }
                        if (sVar11 != uVar4) {
                          puVar22 = *(uint8_t **)(*plVar1 + -8 + uVar17 * 8);
                          puVar15 = getLeaf(local_100,(uint)sVar11);
                          commit(puVar22,puVar15,local_220.proofs[uVar23].aux,local_220.salt,uVar23,
                                 sVar11,instance);
                        }
                        memcpy(*(void **)(*plVar1 + (ulong)uVar4 * 8),local_220.proofs[uVar23].C,
                               (ulong)instance->digest_size);
                      }
                      if (uVar23 < (instance->num_rounds & 0xfffffffc)) {
                        if ((leafIndex + 1 & 3) == 0) {
                          commit_h_x4((uint8_t **)
                                      ((ulong)((leafIndex & 0xfffc) << 3) + (long)local_128.hashes),
                                      local_180,instance);
                        }
                      }
                      else {
                        commit_h(local_128.hashes[uVar23],
                                 (commitments_t *)
                                 ((long)&local_180[0].hashes + (ulong)((leafIndex & 3) << 4)),
                                 instance);
                      }
                      clearTree(local_100);
                    }
                    for (uVar17 = 0; uVar4 != uVar17; uVar17 = uVar17 + 1) {
                      iVar9 = contains(local_220.challengeC,(ulong)instance->num_opened_rounds,
                                       (uint16_t)uVar17);
                      if (iVar9 == 0) {
                        local_138.hashes[uVar17] = (uint8_t *)0x0;
                      }
                    }
                    uVar17 = 0;
                    while( true ) {
                      iVar9 = -1;
                      bVar2 = instance->num_opened_rounds;
                      if (bVar2 <= uVar17) break;
                      uVar4 = local_220.challengeC[uVar17];
                      uVar5 = local_220.challengeP[uVar17];
                      prVar25 = __ptr + uVar4;
                      bVar2 = instance->num_MPC_parties;
                      puVar22 = local_220.proofs[uVar4].aux;
                      puVar15 = local_220.proofs[uVar4].input;
                      lVar26 = 1;
                      uVar23 = 0;
                      for (uVar24 = 0; uVar24 < (instance->lowmc).r; uVar24 = uVar24 + 1) {
                        uVar20 = 0;
                        while( true ) {
                          uVar6 = (instance->lowmc).n;
                          if (uVar6 <= uVar20) break;
                          uVar19 = lVar26 * (ulong)uVar6 + uVar20 >> 3;
                          cVar7 = (char)uVar20;
                          uVar20 = uVar20 + 1;
                          bVar16 = ~((char)lVar26 * (char)uVar6 + cVar7);
                          bVar3 = bVar16 & 7;
                          prVar25->tape[(ulong)bVar2 - 1][uVar19] =
                               ((puVar22[uVar23 >> 3] >> (~(byte)uVar23 & 7) & 1) != 0) <<
                               (bVar16 & 7) |
                               (-2 << bVar3 | 0xfeU >> 8 - bVar3) &
                               prVar25->tape[(ulong)bVar2 - 1][uVar19];
                          uVar23 = uVar23 + 1;
                        }
                        lVar26 = lVar26 + 2;
                      }
                      uVar23 = (ulong)((uint)uVar5 * 8);
                      memset(*(void **)((long)prVar25->tape + uVar23),0,
                             (ulong)((uint)instance->view_size * 2));
                      memcpy(*(void **)((long)msgs->msgs + uVar23),local_220.proofs[uVar4].msgs,
                             (ulong)instance->view_size);
                      mzd_from_char_array(&local_1c0,puVar15,(ulong)instance->input_output_size);
                      msgs->unopened = (uint)uVar5;
                      msgs->pos = 0;
                      iVar9 = (*local_118)(&local_1c0,prVar25,msgs,local_80,local_190,instance);
                      if (iVar9 != 0) goto LAB_0011a825;
                      commit_v(local_138.hashes[uVar4],local_220.proofs[uVar4].input,msgs,instance);
                      uVar17 = uVar17 + 1;
                    }
                    uVar4 = instance->num_rounds;
                    puVar12 = getMissingLeavesList(local_220.challengeC,instance);
                    iVar10 = addMerkleNodes(&local_c0,puVar12,(ulong)uVar4 - (ulong)bVar2,
                                            local_220.cvInfo,local_220.cvInfoLen);
                    free(puVar12);
                    if ((iVar10 == 0) &&
                       (iVar10 = verifyMerkleTree(&local_c0,local_138.hashes,local_220.salt,instance
                                                 ), iVar10 == 0)) {
                      HCP((uint8_t *)local_100,local_198,local_1a0,&local_128,local_c0.nodes,
                          local_220.salt,local_190,local_188,local_110,local_108,instance);
                      iVar9 = bcmp(local_220.challenge,local_100,(ulong)instance->digest_size);
                      iVar9 = -(uint)(iVar9 != 0);
                    }
                    goto LAB_0011a829;
                  }
                  goto LAB_0011a879;
                }
              }
              goto LAB_0011a886;
            }
            iVar9 = -1;
            goto LAB_0011a8b7;
          }
          iVar9 = -1;
          goto LAB_0011a8c1;
        }
      }
    }
  }
  iVar9 = 1;
  goto LAB_00119f0e;
LAB_0011a825:
  iVar9 = -1;
LAB_0011a829:
  prVar25 = __ptr;
  for (uVar17 = 0; uVar17 < instance->num_rounds; uVar17 = uVar17 + 1) {
    freeRandomTape(prVar25);
    prVar25 = prVar25 + 1;
  }
  freeCommitments2(&local_138);
  freeCommitments2(&local_128);
LAB_0011a879:
  clearTree(&local_a0);
LAB_0011a886:
  free(__ptr);
  free(local_1a0);
  free(local_198);
  clearTree(&local_c0);
LAB_0011a8b7:
  freeMsgs(msgs);
LAB_0011a8c1:
  freeCommitments2(local_180 + 3);
  freeCommitments2(local_180 + 2);
  freeCommitments2(local_180 + 1);
  freeCommitments2(local_180);
LAB_00119f0e:
  freeSignature2(&local_220,instance);
  return iVar9;
}

Assistant:

int impl_verify_picnic3(const picnic_instance_t* instance, const uint8_t* plaintext,
                        const uint8_t* public_key, const uint8_t* msg, size_t msglen,
                        const uint8_t* signature, size_t signature_len) {
  int ret = -1;
  signature2_t sig;
  if (!allocateSignature2(&sig, instance)) {
    goto Exit;
  }

  ret = deserializeSignature2(&sig, signature, signature_len, instance);
  if (ret != EXIT_SUCCESS) {
#if !defined(NDEBUG)
    fprintf(stderr, "Failed to deserialize signature\n");
    fflush(stderr);
#endif
    goto Exit;
  }

  ret = verify_picnic3(&sig, public_key, plaintext, msg, msglen, instance);

Exit:
  freeSignature2(&sig, instance);
  return ret;
}